

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yang_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  byte bVar1;
  uint attr_value;
  char *__s;
  lys_node *__s_00;
  lyout *plVar2;
  lyout *out_00;
  ushort uVar3;
  LYS_NODE LVar4;
  int iVar5;
  int iVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  char *pcVar10;
  lys_when *plVar11;
  int flag_00;
  long lVar12;
  ulong uVar13;
  lys_ext_instance **pplVar14;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  LYS_NODE LVar19;
  int local_4c;
  ulong uStack_48;
  int flag_1;
  lyout *local_40;
  int local_34 [2];
  int flag;
  
  uVar18 = (ulong)(uint)level;
  LVar4 = node->nodetype;
  if ((LVar4 & mask) == LYS_UNKNOWN) goto LAB_001854a6;
  if (((LVar4 & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
    return;
  }
  plVar9 = node->parent;
  if (plVar9 == (lys_node *)0x0) {
LAB_00185491:
    ly_print(out,"\n");
    LVar4 = node->nodetype;
  }
  else if (plVar9->nodetype == LYS_AUGMENT) {
    if (plVar9->child != node) goto LAB_00185491;
  }
  else if (node->prev->next != (lys_node *)0x0) goto LAB_00185491;
LAB_001854a6:
  LVar19 = mask & LVar4;
  uStack_48 = uVar18;
  local_40 = out;
  if ((int)LVar19 < 0x100) {
    if ((int)LVar19 < 0x10) {
      switch(LVar19) {
      case LYS_CONTAINER:
        local_34[0] = 0;
        ly_print(out,"%*scontainer %s",(ulong)(uint)(level * 2),"",node->name);
        iVar5 = level + 1;
        yang_print_snode_common(out,iVar5,node,node->module,local_34,1);
        plVar2 = local_40;
        plVar11 = (lys_when *)node[1].name;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            plVar11 = (lys_when *)node[1].name;
          }
          yang_print_when(plVar2,iVar5,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar5,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar18 < node->iffeature_size);
        }
        if (node->padding[1] != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_must(local_40,iVar5,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar18 < node->padding[1]);
        }
        plVar2 = local_40;
        pcVar16 = *(char **)&node[1].flags;
        if (pcVar16 != (char *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            pcVar16 = *(char **)&node[1].flags;
          }
          yang_print_substmt(plVar2,iVar5,LYEXT_SUBSTMT_PRESENCE,'\0',pcVar16,node->module,node->ext
                             ,(uint)node->ext_size);
        }
        yang_print_snode_common(plVar2,iVar5,node,node->module,local_34,0x74);
        if (*(short *)(node->padding + 2) != 0) {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_typedef(local_40,iVar5,node->module,(lys_tpdf *)(node[1].ref + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x80;
          } while (uVar18 < *(ushort *)(node->padding + 2));
        }
        out = local_40;
        plVar9 = node->child;
        if (plVar9 != (lys_node *)0x0) {
          do {
            if (plVar9->parent == node) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_snode(out,iVar5,plVar9,0x800);
            }
            plVar9 = plVar9->next;
          } while (plVar9 != (lys_node *)0x0);
          plVar9 = node->child;
          if (plVar9 != (lys_node *)0x0) {
            do {
              if (plVar9->parent == node) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_snode(out,iVar5,plVar9,0x903f);
              }
              plVar9 = plVar9->next;
            } while (plVar9 != (lys_node *)0x0);
            plVar9 = node->child;
            if (plVar9 != (lys_node *)0x0) {
              do {
                if (plVar9->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar5,plVar9,0x4000);
                }
                plVar9 = plVar9->next;
              } while (plVar9 != (lys_node *)0x0);
              for (plVar9 = node->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
                if (plVar9->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar5,plVar9,0x80);
                }
              }
            }
          }
        }
        break;
      case LYS_CHOICE:
        local_34[0] = 0;
        ly_print(out,"%*schoice %s",(ulong)(uint)(level * 2),"",node->name);
        iVar5 = level + 1;
        yang_print_snode_common(out,iVar5,node,node->module,local_34,1);
        plVar2 = local_40;
        plVar11 = *(lys_when **)node->hash;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            plVar11 = *(lys_when **)node->hash;
          }
          yang_print_when(plVar2,iVar5,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar5,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar18 < node->iffeature_size);
        }
        out = local_40;
        pcVar16 = node[1].name;
        if (pcVar16 != (char *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            pcVar16 = node[1].name;
          }
          yang_print_substmt(out,iVar5,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)pcVar16,node->module,
                             node->ext,(uint)node->ext_size);
        }
        yang_print_snode_common(out,iVar5,node,node->module,local_34,0x7c);
        for (plVar9 = node->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
          if (plVar9->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar5,plVar9,0x807f);
          }
        }
        break;
      default:
        goto switchD_001854e7_caseD_3;
      case LYS_LEAF:
        ly_print(out,"%*sleaf %s {\n");
        uVar17 = level + 1;
        if (node->ext_size != 0) {
          yang_print_extension_instances
                    (out,uVar17,node->module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size)
          ;
        }
        if ((lys_when *)node[1].name != (lys_when *)0x0) {
          yang_print_when(out,uVar17,node->module,(lys_when *)node[1].name);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            yang_print_iffeature
                      (out,uVar17,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar18 < node->iffeature_size);
        }
        yang_print_type(out,uVar17,node->module,(lys_type *)&node[1].ref);
        yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_UNITS,'\0',(char *)node[1].next,node->module,
                           node->ext,(uint)node->ext_size);
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            yang_print_must(out,uVar17,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar18 < node->padding[3]);
        }
        plVar9 = node[1].prev;
        if (plVar9 != (lys_node *)0x0) {
          if ((node->flags & 0x1000) != 0) {
            uStack_48 = (ulong)uVar17;
            pcVar16 = strchr((char *)plVar9,0x3a);
            if (pcVar16 == (char *)0x0) {
              __assert_fail("strchr(leaf->dflt, \':\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yang.c"
                            ,0x470,
                            "void yang_print_leaf(struct lyout *, int, const struct lys_node *)");
            }
            plVar7 = lys_node_module(node);
            pcVar16 = plVar7->name;
            __s_00 = node[1].prev;
            pcVar15 = strchr((char *)__s_00,0x3a);
            iVar5 = strncmp((char *)plVar9,pcVar16,(long)pcVar15 - (long)__s_00);
            if (iVar5 == 0) {
              plVar9 = (lys_node *)lydict_insert(node->module->ctx,pcVar15 + 1,0);
            }
            else {
              plVar9 = (lys_node *)transform_json2schema(node->module,(char *)__s_00);
            }
            uVar17 = (uint)uStack_48;
            out = local_40;
          }
          yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar9,node->module,
                             node->ext,(uint)node->ext_size);
          if ((node->flags & 0x1000) != 0) {
            lydict_remove(node->module->ctx,(char *)plVar9);
          }
        }
        yang_print_snode_common(out,uVar17,node,node->module,(int *)0x0,0x7c);
        goto LAB_0018741f;
      case LYS_LEAFLIST:
        ly_print(out,"%*sleaf-list %s {\n");
        uVar17 = level + 1;
        uVar18 = (ulong)uVar17;
        if (node->ext_size != 0) {
          yang_print_extension_instances
                    (out,uVar17,node->module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size)
          ;
        }
        if ((lys_when *)node[1].name != (lys_when *)0x0) {
          yang_print_when(out,uVar17,node->module,(lys_when *)node[1].name);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar13 = 0;
          do {
            yang_print_iffeature
                      (out,uVar17,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar13 < node->iffeature_size);
        }
        yang_print_type(out,uVar17,node->module,(lys_type *)&node[1].ref);
        yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_UNITS,'\0',(char *)node[1].next,node->module,
                           node->ext,(uint)node->ext_size);
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar13 = 0;
          do {
            yang_print_must(out,uVar17,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar13 < node->padding[3]);
        }
        if (node->padding[2] != '\0') {
          uVar13 = 0;
          uStack_48 = uVar18;
          do {
            pcVar16 = *(char **)((node[1].prev)->padding + uVar13 * 8 + -0x1c);
            if ((node->flags & 0x1000) != 0) {
              pcVar15 = strchr(pcVar16,0x3a);
              if (pcVar15 == (char *)0x0) {
                __assert_fail("strchr(llist->dflt[i], \':\')",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yang.c"
                              ,0x4bf,
                              "void yang_print_leaflist(struct lyout *, int, const struct lys_node *)"
                             );
              }
              plVar7 = lys_node_module(node);
              pcVar15 = plVar7->name;
              __s = *(char **)((node[1].prev)->padding + uVar13 * 8 + -0x1c);
              pcVar10 = strchr(__s,0x3a);
              iVar5 = strncmp(pcVar16,pcVar15,(long)pcVar10 - (long)__s);
              if (iVar5 == 0) {
                pcVar16 = lydict_insert(node->module->ctx,pcVar10 + 1,0);
                out = local_40;
                uVar18 = uStack_48;
              }
              else {
                pcVar16 = transform_json2schema(node->module,__s);
                out = local_40;
                uVar18 = uStack_48;
              }
            }
            uVar17 = (uint)uVar18;
            yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar13,pcVar16,node->module
                               ,node->ext,(uint)node->ext_size);
            if ((node->flags & 0x1000) != 0) {
              lydict_remove(node->module->ctx,pcVar16);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < node->padding[2]);
        }
        yang_print_snode_common(out,uVar17,node,node->module,(int *)0x0,4);
        if (*(uint *)&node[1].priv != 0) {
          yang_print_unsigned(out,uVar17,LYEXT_SUBSTMT_MIN,'\0',node->module,node->ext,
                              (uint)node->ext_size,*(uint *)&node[1].priv);
        }
        attr_value = *(uint *)((long)&node[1].priv + 4);
        if (attr_value != 0) {
          yang_print_unsigned(out,uVar17,LYEXT_SUBSTMT_MAX,'\0',node->module,node->ext,
                              (uint)node->ext_size,attr_value);
        }
        if ((node->flags & 0x100) == 0) {
          iVar5 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
          if (iVar5 != -1) {
            pcVar16 = "system";
            goto LAB_001870b8;
          }
        }
        else {
          pcVar16 = "user";
LAB_001870b8:
          yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar16,node->module,node->ext,
                             (uint)node->ext_size);
        }
        yang_print_snode_common(out,uVar17,node,node->module,(int *)0x0,0x70);
LAB_0018741f:
        ly_print(out,"%*s}\n",(ulong)(uint)(level * 2),"");
        return;
      }
    }
    else if ((int)LVar19 < 0x40) {
      if (LVar19 == LYS_LIST) {
        local_34[0] = 0;
        ly_print(out,"%*slist %s",(ulong)(uint)(level * 2),"",node->name);
        iVar5 = level + 1;
        yang_print_snode_common(out,iVar5,node,node->module,local_34,1);
        plVar2 = local_40;
        plVar11 = (lys_when *)node[1].name;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
            plVar11 = (lys_when *)node[1].name;
          }
          yang_print_when(plVar2,iVar5,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar5,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar18 < node->iffeature_size);
        }
        if (node->padding[0] != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_must(local_40,iVar5,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar18 < node->padding[0]);
        }
        uVar18 = uStack_48;
        if (node->padding[2] != '\0') {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_substmt(local_40,iVar5,LYEXT_SUBSTMT_KEY,'\0',(char *)node[1].module,
                             node->module,node->ext,(uint)node->ext_size);
        }
        if (node->padding[3] != '\0') {
          uVar13 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_unique(local_40,iVar5,node->module,(lys_unique *)(node[1].ext + uVar13 * 2));
            pplVar14 = node->ext;
            iVar6 = -1;
            while (iVar6 = lys_ext_iter(pplVar14,node->ext_size,(char)iVar6 + '\x01',
                                        LYEXT_SUBSTMT_UNIQUE), iVar6 != -1) {
              pplVar14 = node->ext;
              if (uVar13 == pplVar14[iVar6]->insubstmt_index) {
                ly_print(local_40," {\n");
                pplVar14 = node->ext;
                do {
                  yang_print_extension_instances
                            (local_40,(int)uVar18 + 2,node->module,LYEXT_SUBSTMT_UNIQUE,
                             (uint8_t)uVar13,pplVar14 + iVar6,1);
                  pplVar14 = node->ext;
                  do {
                    iVar6 = lys_ext_iter(pplVar14,node->ext_size,(char)iVar6 + '\x01',
                                         LYEXT_SUBSTMT_UNIQUE);
                    if (iVar6 == -1) {
                      ly_print(local_40,"%*s}\n",iVar5 * 2,"");
                      goto LAB_00186ec9;
                    }
                    pplVar14 = node->ext;
                  } while (uVar13 != pplVar14[iVar6]->insubstmt_index);
                } while( true );
              }
            }
            ly_print(local_40,";\n");
LAB_00186ec9:
            uVar13 = uVar13 + 1;
          } while (uVar13 < node->padding[3]);
        }
        plVar2 = local_40;
        yang_print_snode_common(local_40,iVar5,node,node->module,local_34,4);
        uVar17 = *(uint *)&node[1].iffeature;
        if (uVar17 != 0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
            uVar17 = *(uint *)&node[1].iffeature;
          }
          yang_print_unsigned(plVar2,iVar5,LYEXT_SUBSTMT_MIN,'\0',node->module,node->ext,
                              (uint)node->ext_size,uVar17);
        }
        uVar17 = *(uint *)((long)&node[1].iffeature + 4);
        if (uVar17 != 0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
            uVar17 = *(uint *)((long)&node[1].iffeature + 4);
          }
          yang_print_unsigned(plVar2,iVar5,LYEXT_SUBSTMT_MAX,'\0',node->module,node->ext,
                              (uint)node->ext_size,uVar17);
        }
        if ((node->flags & 0x100) == 0) {
          iVar6 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
          if (iVar6 != -1) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(plVar2," {\n");
            }
            plVar7 = node->module;
            bVar1 = node->ext_size;
            pcVar16 = "system";
            goto LAB_0018713e;
          }
        }
        else {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
          }
          plVar7 = node->module;
          bVar1 = node->ext_size;
          pcVar16 = "user";
LAB_0018713e:
          yang_print_substmt(plVar2,iVar5,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar16,plVar7,node->ext,
                             (uint)bVar1);
        }
        yang_print_snode_common(plVar2,iVar5,node,node->module,local_34,0x70);
        if (node->padding[1] != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_typedef(local_40,iVar5,node->module,(lys_tpdf *)(node[1].ref + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x80;
          } while (uVar18 < node->padding[1]);
        }
        out = local_40;
        plVar9 = node->child;
        if (plVar9 != (lys_node *)0x0) {
          do {
            if (plVar9->parent == node) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_snode(out,iVar5,plVar9,0x800);
            }
            plVar9 = plVar9->next;
          } while (plVar9 != (lys_node *)0x0);
          plVar9 = node->child;
          if (plVar9 != (lys_node *)0x0) {
            do {
              if (plVar9->parent == node) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_snode(out,iVar5,plVar9,0x903f);
              }
              plVar9 = plVar9->next;
            } while (plVar9 != (lys_node *)0x0);
            plVar9 = node->child;
            if (plVar9 != (lys_node *)0x0) {
              do {
                if (plVar9->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar5,plVar9,0x4000);
                }
                plVar9 = plVar9->next;
              } while (plVar9 != (lys_node *)0x0);
              for (plVar9 = node->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
                if (plVar9->parent == node) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_snode(out,iVar5,plVar9,0x80);
                }
              }
            }
          }
        }
      }
      else {
        if (LVar19 != LYS_ANYXML) {
          return;
        }
LAB_00185f0a:
        local_34[0] = 0;
        plVar9 = lys_parent(node);
        pcVar16 = node->name;
        if (((plVar9 == (lys_node *)0x0) && (iVar5 = strcmp(pcVar16,"config"), iVar5 == 0)) &&
           (iVar5 = strcmp(node->module->name,"ietf-netconf"), iVar5 == 0)) {
          return;
        }
        pcVar15 = "anydata";
        if (node->nodetype == LYS_ANYXML) {
          pcVar15 = "anyxml";
        }
        ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar15,pcVar16);
        iVar5 = level + 1;
        yang_print_snode_common(out,iVar5,node,node->module,local_34,1);
        plVar11 = (lys_when *)node[1].name;
        if (plVar11 != (lys_when *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
            plVar11 = (lys_when *)node[1].name;
          }
          yang_print_when(out,iVar5,node->module,plVar11);
        }
        if (node->iffeature_size != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_iffeature
                      (local_40,iVar5,node->module,
                       (lys_iffeature *)((long)&node->iffeature->expr + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar18 < node->iffeature_size);
        }
        if (node->padding[3] != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_must(local_40,iVar5,node->module,(lys_restr *)(node[1].dsc + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar18 < node->padding[3]);
        }
        out = local_40;
        yang_print_snode_common(local_40,iVar5,node,node->module,local_34,0x7c);
      }
    }
    else {
      if (LVar19 == LYS_CASE) {
        local_34[0] = 0;
        if ((node->flags & 0x40) == 0) {
          ly_print(out,"%*scase %s",(ulong)(uint)(level * 2),"",node->name);
          level = level + 1;
          yang_print_snode_common(out,level,node,node->module,local_34,1);
          plVar11 = *(lys_when **)node->hash;
          if (plVar11 != (lys_when *)0x0) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
              plVar11 = *(lys_when **)node->hash;
            }
            yang_print_when(out,level,node->module,plVar11);
          }
          yang_print_snode_common(out,level,node,node->module,local_34,0x72);
        }
        else {
          local_34[0] = 1;
        }
        for (plVar9 = node->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
          if (plVar9->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,level,plVar9,0x903f);
          }
        }
        if ((node->flags & 0x40) != 0) {
          return;
        }
        iVar6 = level + -1;
        flag_00 = local_34[0];
        goto LAB_00187318;
      }
      if (LVar19 != LYS_NOTIF) {
        return;
      }
      local_34[0] = 0;
      ly_print(out,"%*snotification %s",(ulong)(uint)(level * 2),"",node->name);
      iVar5 = level + 1;
      yang_print_snode_common(out,iVar5,node,node->module,local_34,3);
      if (node->padding[1] != '\0') {
        lVar12 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_must(local_40,iVar5,node->module,(lys_restr *)(node[1].dsc + lVar12));
          uVar18 = uVar18 + 1;
          lVar12 = lVar12 + 0x38;
        } while (uVar18 < node->padding[1]);
      }
      yang_print_snode_common(local_40,iVar5,node,node->module,local_34,0x70);
      if (*(short *)(node->padding + 2) != 0) {
        lVar12 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_typedef(local_40,iVar5,node->module,(lys_tpdf *)(node[1].name + lVar12));
          uVar18 = uVar18 + 1;
          lVar12 = lVar12 + 0x80;
        } while (uVar18 < *(ushort *)(node->padding + 2));
      }
      out = local_40;
      plVar9 = node->child;
      if (plVar9 != (lys_node *)0x0) {
        do {
          if (plVar9->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar5,plVar9,0x800);
          }
          plVar9 = plVar9->next;
        } while (plVar9 != (lys_node *)0x0);
        for (plVar9 = node->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
          if (plVar9->parent == node) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar5,plVar9,0x903f);
          }
        }
      }
    }
LAB_00187314:
    iVar6 = (int)uStack_48;
    flag_00 = local_34[0];
  }
  else {
    if ((int)LVar19 < 0x800) {
      if (LVar19 != LYS_RPC) {
        if ((LVar19 != LYS_INPUT) && (LVar19 != LYS_OUTPUT)) {
          return;
        }
        ly_print(out,"%*s%s {\n");
        iVar5 = level + 1;
        if (node->ext_size != 0) {
          yang_print_extension_instances
                    (out,iVar5,node->module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size);
        }
        if (node->padding[1] != '\0') {
          lVar12 = 0;
          uVar18 = 0;
          do {
            yang_print_must(out,iVar5,node->module,(lys_restr *)(node[1].name + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar18 < node->padding[1]);
        }
        if (*(short *)(node->padding + 2) != 0) {
          lVar12 = 0;
          uVar18 = 0;
          do {
            yang_print_typedef(out,iVar5,node->module,(lys_tpdf *)(*(long *)node->hash + lVar12));
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x80;
          } while (uVar18 < *(ushort *)(node->padding + 2));
        }
        plVar9 = node->child;
        if (plVar9 != (lys_node *)0x0) {
          do {
            if (plVar9->parent == node) {
              yang_print_snode(out,iVar5,plVar9,0x800);
            }
            plVar9 = plVar9->next;
          } while (plVar9 != (lys_node *)0x0);
          for (plVar9 = node->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
            if (plVar9->parent == node) {
              yang_print_snode(out,iVar5,plVar9,0x903f);
            }
          }
        }
        goto LAB_0018741f;
      }
LAB_001862a3:
      local_34[0] = 0;
      pcVar16 = "action";
      if (LVar4 == LYS_RPC) {
        pcVar16 = "rpc";
      }
      ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar16,node->name);
      iVar5 = level + 1;
      yang_print_snode_common(out,iVar5,node,node->module,local_34,0x73);
      if (*(short *)(node->padding + 2) != 0) {
        lVar12 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_typedef(local_40,iVar5,node->module,(lys_tpdf *)(node[1].name + lVar12));
          uVar18 = uVar18 + 1;
          lVar12 = lVar12 + 0x80;
        } while (uVar18 < *(ushort *)(node->padding + 2));
      }
      out = local_40;
      for (plVar9 = node->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
        if ((plVar9->parent == node) &&
           (((plVar9->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
            ((plVar9->flags & 0x40) == 0)))) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar5,plVar9,0xe00);
        }
      }
      goto LAB_00187314;
    }
    if (0x3fff < (int)LVar19) {
      if (LVar19 != LYS_ACTION) {
        if (LVar19 != LYS_ANYDATA) {
          return;
        }
        goto LAB_00185f0a;
      }
      goto LAB_001862a3;
    }
    if (LVar19 == LYS_GROUPING) {
      local_34[0] = 0;
      ly_print(out,"%*sgrouping %s",(ulong)(uint)(level * 2),"",node->name);
      iVar5 = level + 1;
      yang_print_snode_common(out,iVar5,node,node->module,local_34,0x71);
      if (*(short *)(node->padding + 2) != 0) {
        lVar12 = 0;
        uVar18 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(local_40," {\n");
          }
          yang_print_typedef(local_40,iVar5,node->module,(lys_tpdf *)(*(long *)node->hash + lVar12))
          ;
          uVar18 = uVar18 + 1;
          lVar12 = lVar12 + 0x80;
        } while (uVar18 < *(ushort *)(node->padding + 2));
      }
      plVar2 = local_40;
      plVar9 = node->child;
      iVar6 = (int)uStack_48;
      out = local_40;
      flag_00 = local_34[0];
      if (plVar9 != (lys_node *)0x0) {
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar2," {\n");
          }
          yang_print_snode(plVar2,iVar5,plVar9,0x800);
          out_00 = local_40;
          plVar9 = plVar9->next;
        } while (plVar9 != (lys_node *)0x0);
        plVar9 = node->child;
        iVar6 = (int)uStack_48;
        out = local_40;
        flag_00 = local_34[0];
        if (plVar9 != (lys_node *)0x0) {
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out_00," {\n");
            }
            yang_print_snode(out_00,iVar5,plVar9,0x903f);
            plVar2 = local_40;
            plVar9 = plVar9->next;
          } while (plVar9 != (lys_node *)0x0);
          plVar9 = node->child;
          iVar6 = (int)uStack_48;
          out = local_40;
          flag_00 = local_34[0];
          if (plVar9 != (lys_node *)0x0) {
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plVar2," {\n");
              }
              yang_print_snode(plVar2,iVar5,plVar9,0x4000);
              plVar9 = plVar9->next;
            } while (plVar9 != (lys_node *)0x0);
            iVar6 = (int)uStack_48;
            out = local_40;
            flag_00 = local_34[0];
            for (plVar9 = node->child; local_40 = out, local_34[0] = flag_00,
                plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
              if (flag_00 == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_snode(local_40,iVar5,plVar9,0x80);
              out = local_40;
              flag_00 = local_34[0];
            }
          }
        }
      }
    }
    else {
      if (LVar19 != LYS_USES) {
        return;
      }
      local_4c = 0;
      ly_print(out,"%*suses ",(ulong)(uint)(level * 2),"");
      if (node->child != (lys_node *)0x0) {
        plVar7 = lys_node_module(node->child);
        plVar8 = lys_node_module(node);
        if (plVar8 != plVar7) {
          pcVar16 = transform_module_name2import_prefix(node->module,plVar7->name);
          ly_print(out,"%s:",pcVar16);
        }
      }
      ly_print(out,"%s",node->name);
      iVar5 = level + 1;
      yang_print_snode_common(out,iVar5,node,node->module,&local_4c,1);
      plVar11 = *(lys_when **)node->hash;
      if (plVar11 != (lys_when *)0x0) {
        if (local_4c == 0) {
          local_4c = 1;
          ly_print(out," {\n");
          plVar11 = *(lys_when **)node->hash;
        }
        yang_print_when(out,iVar5,node->module,plVar11);
      }
      yang_print_snode_common(out,iVar5,node,node->module,&local_4c,0x72);
      if (node->padding[2] != '\0') {
        iVar6 = (int)uStack_48 + 2;
        uVar18 = 0;
        do {
          if (local_4c == 0) {
            local_4c = 1;
            ly_print(out," {\n");
          }
          plVar7 = node->module;
          pcVar16 = node[1].name;
          lVar12 = uVar18 * 0x50;
          plVar9 = (lys_node *)(pcVar16 + lVar12);
          local_34[0] = 0;
          pcVar15 = transform_json2schema(plVar7,*(char **)(pcVar16 + lVar12));
          ly_print(local_40,"%*srefine \"%s\"",(ulong)(uint)(iVar5 * 2),"",pcVar15);
          lydict_remove(plVar7->ctx,pcVar15);
          yang_print_snode_common(local_40,iVar6,plVar9,plVar7,local_34,3);
          if (pcVar16[lVar12 + 0x1e] != '\0') {
            lVar12 = 0;
            uVar13 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(local_40," {\n");
              }
              yang_print_must(local_40,iVar6,plVar7,
                              (lys_restr *)(*(long *)&plVar9->nodetype + lVar12));
              uVar13 = uVar13 + 1;
              lVar12 = lVar12 + 0x38;
            } while (uVar13 < plVar9->padding[2]);
          }
          out = local_40;
          if (*(short *)plVar9->padding == 1) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(local_40," {\n");
            }
            yang_print_substmt(out,iVar6,LYEXT_SUBSTMT_PRESENCE,'\0',(char *)plVar9->child,plVar7,
                               plVar9->ext,(uint)plVar9->ext_size);
          }
          if (plVar9->padding[3] != '\0') {
            uVar13 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_substmt(out,iVar6,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar13,
                                 *(char **)(plVar9->parent->padding + uVar13 * 8 + -0x1c),plVar7,
                                 plVar9->ext,(uint)plVar9->ext_size);
              uVar13 = uVar13 + 1;
            } while (uVar13 < plVar9->padding[3]);
          }
          if ((plVar9->flags & 1) == 0) {
            if ((plVar9->flags & 2) != 0) {
              pcVar16 = "false";
              goto joined_r0x00185b5c;
            }
          }
          else {
            pcVar16 = "true";
joined_r0x00185b5c:
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_substmt(out,iVar6,LYEXT_SUBSTMT_CONFIG,'\0',pcVar16,plVar7,plVar9->ext,
                               (uint)plVar9->ext_size);
          }
          if ((plVar9->flags & 0x40) == 0) {
            if ((char)plVar9->flags < '\0') {
              pcVar16 = "false";
              goto joined_r0x00185bc3;
            }
          }
          else {
            pcVar16 = "true";
joined_r0x00185bc3:
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_substmt(out,iVar6,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar16,plVar7,plVar9->ext,
                               (uint)plVar9->ext_size);
          }
          if ((plVar9->padding[0] & 0x18) != 0) {
            uVar3 = plVar9->flags;
            if ((uVar3 & 0x10) != 0) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_unsigned(out,iVar6,LYEXT_SUBSTMT_MIN,'\0',plVar7,plVar9->ext,
                                  (uint)plVar9->ext_size,*(uint *)&plVar9->child);
              uVar3 = plVar9->flags;
            }
            if ((uVar3 & 8) != 0) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              uVar17 = *(uint *)((long)&plVar9->child + 4);
              if (uVar17 == 0) {
                yang_print_substmt(out,iVar6,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar7,plVar9->ext,
                                   (uint)plVar9->ext_size);
              }
              else {
                yang_print_unsigned(out,iVar6,LYEXT_SUBSTMT_MAX,'\0',plVar7,plVar9->ext,
                                    (uint)plVar9->ext_size,uVar17);
              }
            }
          }
          yang_print_snode_common(out,iVar6,plVar9,plVar7,local_34,0x60);
          yang_print_close(out,iVar5,local_34[0]);
          uVar18 = uVar18 + 1;
        } while (uVar18 < node->padding[2]);
      }
      uVar18 = uStack_48;
      if (node->padding[3] != '\0') {
        lVar12 = 0;
        uVar13 = 0;
        do {
          if (local_4c == 0) {
            local_4c = 1;
            ly_print(local_40," {\n");
          }
          yang_print_augment(local_40,iVar5,(lys_node_augment *)(node[1].dsc + lVar12));
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x68;
        } while (uVar13 < node->padding[3]);
      }
      iVar6 = (int)uVar18;
      out = local_40;
      flag_00 = local_4c;
    }
  }
LAB_00187318:
  yang_print_close(out,iVar6,flag_00);
switchD_001854e7_caseD_3:
  return;
}

Assistant:

static void
yang_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    if (node->nodetype & mask) {
        if ((node->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (node->flags & LYS_IMPLICIT)) {
            /* implicit input/output node is not supposed to be printed */
            return;
        } else if (!node->parent ||
                (node->parent->nodetype == LYS_AUGMENT && node != node->parent->child) ||
                (node->parent->nodetype != LYS_AUGMENT && node->prev->next)) {
            /* do not print the blank line before the first data-def node */
            ly_print(out, "\n");
        }
    }

    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yang_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yang_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yang_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yang_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yang_print_list(out, level, node);
        break;
    case LYS_USES:
        yang_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yang_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yang_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yang_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yang_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yang_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yang_print_notif(out, level, node);
        break;
    default:
        break;
    }
}